

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecodeIT(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint32_t uVar1;
  undefined4 local_38;
  uint mask;
  uint pred;
  DecodeStatus S;
  void *Decoder_local;
  uint64_t Address_local;
  uint Insn_local;
  MCInst *Inst_local;
  
  mask = 3;
  local_38 = fieldFromInstruction_4(Insn,4,4);
  uVar1 = fieldFromInstruction_4(Insn,0,4);
  if (local_38 == 0xf) {
    local_38 = 0xe;
    mask = 1;
  }
  if (uVar1 == 0) {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  else {
    MCOperand_CreateImm0(Inst,(ulong)local_38);
    MCOperand_CreateImm0(Inst,(ulong)uVar1);
    Inst_local._4_4_ = mask;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeIT(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred = fieldFromInstruction_4(Insn, 4, 4);
	unsigned mask = fieldFromInstruction_4(Insn, 0, 4);

	if (pred == 0xF) {
		pred = 0xE;
		S = MCDisassembler_SoftFail;
	}

	if (mask == 0x0)
		return MCDisassembler_Fail;

	MCOperand_CreateImm0(Inst, pred);
	MCOperand_CreateImm0(Inst, mask);
	return S;
}